

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O2

_Bool normalize_forward_slash(char *path,char *dest)

{
  char cVar1;
  char cVar2;
  size_t sVar3;
  bool bVar4;
  bool bVar5;
  
  bVar4 = dest != (char *)0x0 && path != (char *)0x0;
  if (dest == (char *)0x0 || path == (char *)0x0) {
    return bVar4;
  }
  if (*path != *G_FORWARD_SLASH_CHAR && *path != *G_BACKSLASH_CHAR) goto LAB_0014a848;
  path = path + 1;
  *dest = *G_FORWARD_SLASH_CHAR;
  do {
    dest = dest + 1;
LAB_0014a848:
    while( true ) {
      cVar1 = *path;
      if (cVar1 == '\0') {
        *dest = '\0';
        return bVar4;
      }
      sVar3 = GetUTF8Length(cVar1);
      if (sVar3 < 2) break;
      while (bVar5 = sVar3 != 0, sVar3 = sVar3 - 1, bVar5) {
        cVar1 = *path;
        path = path + 1;
        *dest = cVar1;
        dest = dest + 1;
      }
    }
    cVar2 = *G_FORWARD_SLASH_CHAR;
    if (cVar1 != *G_BACKSLASH_CHAR) {
      cVar2 = cVar1;
    }
    path = path + 1;
    *dest = cVar2;
  } while( true );
}

Assistant:

bool normalize_forward_slash(const char *path, char *dest)
{
	if (path == NULL || dest == NULL)
	{
		return false;
	}

	const char *p = path;
	char *q = dest;
	if (has_driveletter(path))
	{
		*q++ = *p++;
		*q++ = *p++;
	}
	if ((*p == *G_BACKSLASH_CHAR) || (*p == *G_FORWARD_SLASH_CHAR))
	{
		p++;
		*q++ = *G_FORWARD_SLASH_CHAR;
	}

	while (*p)
	{
		size_t step = GetUTF8Length(*p);
		if (step > 1)
		{
			while (step--)
			{
				*q++ = *p++;
			}
		}
		else if ((*p == *G_BACKSLASH_CHAR) || (*p == *G_FORWARD_SLASH_CHAR))
		{
			p++;
			*q++ = *G_FORWARD_SLASH_CHAR;
		}
		else
		{
			*q++ = *p++;
		}
	}
	*q = '\0';

	return true;
}